

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsembleValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)402>(Result *__return_storage_ptr__,Model *format)

{
  TreeEnsembles local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  TreeEnsembles::constructAndValidateTreeEnsembleFromSpec(local_20,format);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_treeEnsembleClassifier>(const Specification::Model& format) {
        try {
            TreeEnsembles::constructAndValidateTreeEnsembleFromSpec(format);

        } catch (const std::logic_error& error) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, error.what());
        }

        return Result();
    }